

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

string * __thiscall
soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Type *type)

{
  Type *pTVar1;
  bool bVar2;
  anon_class_16_2_06e2585c local_b0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  local_a0;
  anon_class_1_0_00000001 local_69;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  local_68;
  string local_48;
  Type *local_28;
  Type *type_local;
  pool_ptr<const_soul::Module> *context_local;
  ProgramImpl *this_local;
  
  local_28 = type;
  type_local = (Type *)context;
  context_local = (pool_ptr<const_soul::Module> *)this;
  this_local = (ProgramImpl *)__return_storage_ptr__;
  bVar2 = pool_ptr<const_soul::Module>::operator==(context,(void *)0x0);
  pTVar1 = local_28;
  if (bVar2) {
    std::function<std::__cxx11::string(soul::Structure_const&)>::
    function<soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded(soul::pool_ptr<soul::Module_const>,soul::Type_const&)const::_lambda(soul::Structure_const&)_1_,void>
              ((function<std::__cxx11::string(soul::Structure_const&)> *)&local_68,&local_69);
    Type::getDescription(&local_48,pTVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
    ::~function(&local_68);
  }
  pTVar1 = local_28;
  local_b0.context = (pool_ptr<const_soul::Module>)context->object;
  local_b0.this = this;
  std::function<std::__cxx11::string(soul::Structure_const&)>::
  function<soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded(soul::pool_ptr<soul::Module_const>,soul::Type_const&)const::_lambda(soul::Structure_const&)_2_,void>
            ((function<std::__cxx11::string(soul::Structure_const&)> *)&local_a0,&local_b0);
  Type::getDescription(__return_storage_ptr__,pTVar1,&local_a0);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  ::~function(&local_a0);
  const::{lambda(soul::Structure_const&)#2}::~Structure
            ((_lambda_soul__Structure_const___2_ *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescriptionWithQualificationIfNeeded (pool_ptr<const Module> context, const Type& type) const
    {
        if (context == nullptr)
            type.getDescription ([] (const Structure& s) { return s.getName(); });

        return type.getDescription ([this, context] (const Structure& s) { return getStructNameWithQualificationIfNeeded (context, s); });
    }